

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csv.hpp
# Opt level: O3

bool __thiscall csv::CSVReader::read_row(CSVReader *this,CSVRow *row)

{
  ThreadSafeDeque<csv::CSVRow> *this_00;
  _Elt_pointer pCVar1;
  _Elt_pointer pCVar2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_01;
  ulong uVar3;
  element_type *peVar4;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var5;
  CSVRow *pCVar6;
  runtime_error *this_02;
  char *in_R8;
  string_view delim;
  string_view delim_00;
  CSVRow errored_row;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_c0;
  string local_a8;
  CSVRow local_88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  CSVRow *local_38;
  
  local_38 = row;
  while( true ) {
    while( true ) {
      this_00 = (this->records)._M_t.
                super___uniq_ptr_impl<csv::internals::ThreadSafeDeque<csv::CSVRow>,_std::default_delete<csv::internals::ThreadSafeDeque<csv::CSVRow>_>_>
                ._M_t.
                super__Tuple_impl<0UL,_csv::internals::ThreadSafeDeque<csv::CSVRow>_*,_std::default_delete<csv::internals::ThreadSafeDeque<csv::CSVRow>_>_>
                .super__Head_base<0UL,_csv::internals::ThreadSafeDeque<csv::CSVRow>_*,_false>.
                _M_head_impl;
      pCVar1 = ((iterator *)
               ((long)&(this_00->data).super__Deque_base<csv::CSVRow,_std::allocator<csv::CSVRow>_>
               + 0x10))->_M_cur;
      pCVar2 = ((iterator *)
               ((long)&(this_00->data).super__Deque_base<csv::CSVRow,_std::allocator<csv::CSVRow>_>
               + 0x30))->_M_cur;
      if (pCVar2 != pCVar1) break;
      if (this_00->_is_waitable == true) {
        internals::ThreadSafeDeque<csv::CSVRow>::wait(this_00,this_00);
      }
      else {
        if (((this->parser)._M_t.
             super___uniq_ptr_impl<csv::internals::IBasicCSVParser,_std::default_delete<csv::internals::IBasicCSVParser>_>
             ._M_t.
             super__Tuple_impl<0UL,_csv::internals::IBasicCSVParser_*,_std::default_delete<csv::internals::IBasicCSVParser>_>
             .super__Head_base<0UL,_csv::internals::IBasicCSVParser_*,_false>._M_head_impl)->_eof !=
            false) goto LAB_0010a074;
        if ((this->read_csv_worker)._M_id._M_thread != 0) {
          std::thread::join();
        }
        local_88.data.super___shared_ptr<csv::internals::RawCSVData,_(__gnu_cxx::_Lock_policy)2>.
        _M_ptr = (element_type *)read_csv;
        local_88.data.super___shared_ptr<csv::internals::RawCSVData,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        local_a8._M_dataplus._M_p = (pointer)this;
        std::thread::
        thread<bool(csv::CSVReader::*)(unsigned_long),csv::CSVReader*,unsigned_long_const&,void>
                  ((thread *)&local_58,(offset_in_CSVReader_to_subr *)&local_88,
                   (CSVReader **)&local_a8,&internals::ITERATION_CHUNK_SIZE);
        if ((this->read_csv_worker)._M_id._M_thread != 0) {
          std::terminate();
        }
        (this->read_csv_worker)._M_id._M_thread = (native_handle_type)local_58._M_dataplus._M_p;
      }
    }
    if ((pCVar1->row_length == this->n_cols) || ((this->_format).variable_column_policy == KEEP))
    break;
    internals::ThreadSafeDeque<csv::CSVRow>::pop_front(&local_88,this_00);
    if ((this->_format).variable_column_policy == THROW) {
      uVar3 = this->n_cols;
      this_02 = (runtime_error *)__cxa_allocate_exception(0x10);
      if (local_88.row_length < uVar3) {
        CSVRow::operator_cast_to_vector(&local_c0,&local_88);
        delim._M_str = in_R8;
        delim._M_len = (size_t)", ";
        internals::format_row
                  (&local_a8,(internals *)&local_c0,
                   (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)0x2,delim);
        std::operator+(&local_58,"Line too short ",&local_a8);
        std::runtime_error::runtime_error(this_02,(string *)&local_58);
        __cxa_throw(this_02,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      CSVRow::operator_cast_to_vector(&local_c0,&local_88);
      delim_00._M_str = in_R8;
      delim_00._M_len = (size_t)", ";
      internals::format_row
                (&local_a8,(internals *)&local_c0,
                 (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)0x2,delim_00);
      std::operator+(&local_58,"Line too long ",&local_a8);
      std::runtime_error::runtime_error(this_02,(string *)&local_58);
      __cxa_throw(this_02,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    if (local_88.data.super___shared_ptr<csv::internals::RawCSVData,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_88.data.
                 super___shared_ptr<csv::internals::RawCSVData,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
    }
  }
  internals::ThreadSafeDeque<csv::CSVRow>::pop_front(&local_88,this_00);
  pCVar6 = local_38;
  _Var5._M_pi = local_88.data.
                super___shared_ptr<csv::internals::RawCSVData,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi;
  peVar4 = local_88.data.super___shared_ptr<csv::internals::RawCSVData,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
  local_88.data.super___shared_ptr<csv::internals::RawCSVData,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  local_88.data.super___shared_ptr<csv::internals::RawCSVData,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  this_01 = (local_38->data).
            super___shared_ptr<csv::internals::RawCSVData,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
            _M_pi;
  (local_38->data).super___shared_ptr<csv::internals::RawCSVData,_(__gnu_cxx::_Lock_policy)2>._M_ptr
       = peVar4;
  (local_38->data).super___shared_ptr<csv::internals::RawCSVData,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = _Var5._M_pi;
  if (this_01 == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    local_38->row_length = local_88.row_length;
    local_38->data_start = local_88.data_start;
    local_38->fields_start = local_88.fields_start;
  }
  else {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_01);
    pCVar6->row_length = local_88.row_length;
    pCVar6->data_start = local_88.data_start;
    pCVar6->fields_start = local_88.fields_start;
    if (local_88.data.super___shared_ptr<csv::internals::RawCSVData,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_88.data.
                 super___shared_ptr<csv::internals::RawCSVData,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
    }
  }
  this->_n_rows = this->_n_rows + 1;
LAB_0010a074:
  return pCVar2 != pCVar1;
}

Assistant:

CSV_INLINE bool CSVReader::read_row(CSVRow &row) {
        while (true) {
            if (this->records->empty()) {
                if (this->records->is_waitable())
                    // Reading thread is currently active => wait for it to populate records
                    this->records->wait();
                else if (this->parser->eof())
                    // End of file and no more records
                    return false;
                else {
                    // Reading thread is not active => start another one
                    if (this->read_csv_worker.joinable())
                        this->read_csv_worker.join();

                    this->read_csv_worker = std::thread(&CSVReader::read_csv, this, internals::ITERATION_CHUNK_SIZE);
                }
            }
            else if (this->records->front().size() != this->n_cols &&
                this->_format.variable_column_policy != VariableColumnPolicy::KEEP) {
                auto errored_row = this->records->pop_front();

                if (this->_format.variable_column_policy == VariableColumnPolicy::THROW) {
                    if (errored_row.size() < this->n_cols)
                        throw std::runtime_error("Line too short " + internals::format_row(errored_row));

                    throw std::runtime_error("Line too long " + internals::format_row(errored_row));
                }
            }
            else {
                row = this->records->pop_front();
                this->_n_rows++;
                return true;
            }
        }

        return false;
    }